

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O0

void __thiscall gl4cts::BufferStorage::Buffer::UnMap(Buffer *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  Buffer *this_local;
  
  pRVar2 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  UnMap((Functions *)CONCAT44(extraout_var,iVar1),this->m_target);
  return;
}

Assistant:

void Buffer::UnMap()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	UnMap(gl, m_target);
}